

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O3

void lj_lib_prereg(lua_State *L,char *name,lua_CFunction f,GCtab *env)

{
  luaL_findtable(L,-10000,"_PRELOAD",4);
  lua_pushcclosure(L,f,0);
  *(int *)((ulong)L->top[-1].u32.lo + 8) = (int)env;
  lua_setfield(L,-2,name);
  L->top = L->top + -1;
  return;
}

Assistant:

void lj_lib_prereg(lua_State *L, const char *name, lua_CFunction f, GCtab *env)
{
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD", 4);
  lua_pushcfunction(L, f);
  /* NOBARRIER: The function is new (marked white). */
  setgcref(funcV(L->top-1)->c.env, obj2gco(env));
  lua_setfield(L, -2, name);
  L->top--;
}